

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void nc_compute_weights(int n,double x_min,double x_max,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  double local_58;
  double yvalb;
  double yvala;
  int local_40;
  int k;
  int j;
  int i;
  double *d;
  double *w_local;
  double *x_local;
  double x_max_local;
  double x_min_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (k = 1; k <= n; k = k + 1) {
    for (local_40 = 1; local_40 <= n; local_40 = local_40 + 1) {
      *(undefined8 *)((long)pvVar3 + (long)(local_40 + -1) * 8) = 0;
    }
    *(undefined8 *)((long)pvVar3 + (long)(k + -1) * 8) = 0x3ff0000000000000;
    for (local_40 = 2; local_40 <= n; local_40 = local_40 + 1) {
      for (yvala._4_4_ = local_40; yvala._4_4_ <= n; yvala._4_4_ = yvala._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)(((n + local_40) - yvala._4_4_) + -1) * 8) =
             (*(double *)((long)pvVar3 + (long)(((n + local_40) - yvala._4_4_) + -2) * 8) -
             *(double *)((long)pvVar3 + (long)(((n + local_40) - yvala._4_4_) + -1) * 8)) /
             (x[n - yvala._4_4_] - x[((n + local_40) - yvala._4_4_) + -1]);
      }
    }
    for (local_40 = 1; local_40 <= n + -1; local_40 = local_40 + 1) {
      for (yvala._4_4_ = 1; yvala._4_4_ <= n - local_40; yvala._4_4_ = yvala._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)((n - yvala._4_4_) + -1) * 8) =
             -x[(n - yvala._4_4_) - local_40] *
             *(double *)((long)pvVar3 + (long)(n - yvala._4_4_) * 8) +
             *(double *)((long)pvVar3 + (long)((n - yvala._4_4_) + -1) * 8);
      }
    }
    yvalb = *(double *)((long)pvVar3 + (long)(n + -1) * 8) / (double)n;
    for (local_40 = n + -2; -1 < local_40; local_40 = local_40 + -1) {
      yvalb = yvalb * x_min +
              *(double *)((long)pvVar3 + (long)local_40 * 8) / (double)(local_40 + 1);
    }
    local_58 = *(double *)((long)pvVar3 + (long)(n + -1) * 8) / (double)n;
    for (local_40 = n + -2; -1 < local_40; local_40 = local_40 + -1) {
      local_58 = local_58 * x_max +
                 *(double *)((long)pvVar3 + (long)local_40 * 8) / (double)(local_40 + 1);
    }
    w[k + -1] = local_58 * x_max - yvalb * x_min;
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void nc_compute_weights ( int n, double x_min, double x_max, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NC_COMPUTE_WEIGHTS computes weights for a Newton-Cotes quadrature rule.
//
//  Discussion:
//
//    For the interval [X_MIN,X_MAX], the Newton-Cotes quadrature rule 
//    estimates
//
//      Integral ( X_MIN <= X <= X_MAX ) F(X) dX
//
//    using N abscissas X and weights W:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//    For the CLOSED rule, the abscissas include the end points.
//    For the OPEN rule, the abscissas do not include the end points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 June 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double X_MIN, X_MAX, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double yvala;
  double yvalb;

  d = new double[n];

  for ( i = 1; i <= n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 1; j <= n; j++ )
    {
      d[j-1] = 0.0;
    }
    d[i-1] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the left and
//  right endpoints.
//
    yvala = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvala = yvala * x_min + d[j] / double( j + 1 );
    }
    yvala = yvala * x_min;

    yvalb = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvalb = yvalb * x_max + d[j] / double( j + 1 );
    }
    yvalb = yvalb * x_max;

    w[i-1] = yvalb - yvala;
  }

  delete [] d;

  return;
}